

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

void my_progress_monitor(j_common_ptr dinfo)

{
  jpeg_error_mgr *pjVar1;
  jpeg_progress_mgr *pjVar2;
  _func_void_j_common_ptr *p_Var3;
  long in_FS_OFFSET;
  
  if ((dinfo->is_decompressor != 0) && (500 < *(int *)((long)&dinfo[4].mem + 4))) {
    pjVar1 = dinfo->err;
    pjVar2 = dinfo->progress;
    p_Var3 = pjVar2[1].progress_monitor;
    *(undefined8 *)(p_Var3 + 0x627) = 0x3035206e61687420;
    *(undefined8 *)(p_Var3 + 0x62f) = 0x736e6163732030;
    *(undefined8 *)(p_Var3 + 0x618) = 0x68206567616d6920;
    *(undefined8 *)(p_Var3 + 0x620) = 0x2065726f6d207361;
    *(undefined8 *)(p_Var3 + 0x608) = 0x73736572676f7250;
    *(undefined8 *)(p_Var3 + 0x610) = 0x4745504a20657669;
    builtin_strncpy((char *)(in_FS_OFFSET + -0xd0),"Progress",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -200),"ive JPEG",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -0xc0)," image h",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -0xb8),"as more ",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -0xb1)," than 50",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -0xa9),"0 scans",8);
    *(undefined4 *)(pjVar2[1].progress_monitor + 0x6d0) = 1;
    pjVar1[2].msg_code = 0;
    longjmp((__jmp_buf_tag *)(pjVar1 + 1),1);
  }
  return;
}

Assistant:

static void my_progress_monitor(j_common_ptr dinfo)
{
  my_error_ptr myerr = (my_error_ptr)dinfo->err;
  my_progress_ptr myprog = (my_progress_ptr)dinfo->progress;

  if (dinfo->is_decompressor) {
    int scan_no = ((j_decompress_ptr)dinfo)->input_scan_number;

    if (scan_no > 500) {
      snprintf(myprog->this->errStr, JMSG_LENGTH_MAX,
               "Progressive JPEG image has more than 500 scans");
      snprintf(errStr, JMSG_LENGTH_MAX,
               "Progressive JPEG image has more than 500 scans");
      myprog->this->isInstanceError = TRUE;
      myerr->warning = FALSE;
      longjmp(myerr->setjmp_buffer, 1);
    }
  }
}